

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emoticon.cpp
# Opt level: O3

void __thiscall CEmoticon::OnRender(CEmoticon *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  CGameClient *pCVar4;
  CNetObj_GameData *pCVar5;
  IGraphics *pIVar6;
  undefined1 auVar7 [16];
  int iVar8;
  CUIRect *pCVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vec2 vVar14;
  undefined1 auVar15 [16];
  CNetMsg_Cl_Emoticon Msg;
  float local_88;
  float fStack_84;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = (this->super_CComponent).m_pClient;
  if (2 < pCVar4->m_pClient->m_State) {
    if (this->m_Active == false) {
      if ((this->m_WasActive == true) && (this->m_SelectedEmote != -1)) {
        local_40 = CONCAT44(local_40._4_4_,this->m_SelectedEmote);
        IClient::SendPackMsg<CNetMsg_Cl_Emoticon>
                  (pCVar4->m_pClient,(CNetMsg_Cl_Emoticon *)&local_40,1);
      }
      this->m_WasActive = false;
      goto LAB_001428b5;
    }
    if (((pCVar4->m_Snap).m_SpecInfo.m_Active == false) &&
       ((pCVar5 = (pCVar4->m_Snap).m_pGameData, pCVar5 == (CNetObj_GameData *)0x0 ||
        ((pCVar5->m_GameStateFlags & 8) == 0)))) {
      this->m_WasActive = true;
      vVar14 = this->m_SelectorMouse;
      auVar15._8_8_ = 0;
      auVar15._0_4_ = vVar14.field_0;
      auVar15._4_4_ = vVar14.field_1;
      fVar10 = SQRT(vVar14.field_0.x * vVar14.field_0.x + vVar14.field_1.y * vVar14.field_1.y);
      if (170.0 < fVar10) {
        auVar7._4_4_ = fVar10;
        auVar7._0_4_ = fVar10;
        auVar7._8_4_ = fVar10;
        auVar7._12_4_ = fVar10;
        auVar15 = divps(auVar15,auVar7);
        vVar14.field_0.x = auVar15._0_4_ * 170.0;
        vVar14.field_1.y = auVar15._4_4_ * 170.0;
        this->m_SelectorMouse = vVar14;
      }
      fVar11 = atan2f(vVar14.field_1.y,vVar14.field_0.x);
      fVar10 = (this->m_SelectorMouse).field_0.x;
      fVar13 = (this->m_SelectorMouse).field_1.y;
      iVar8 = -1;
      if (110.0 < SQRT(fVar10 * fVar10 + fVar13 * fVar13)) {
        fVar11 = fVar11 + 0.2617994;
        iVar8 = (int)(((float)(~-(uint)(fVar11 < 0.0) & (uint)fVar11 |
                              (uint)(fVar11 + 6.2831855) & -(uint)(fVar11 < 0.0)) / 6.2831855) *
                     16.0);
      }
      this->m_SelectedEmote = iVar8;
      pCVar9 = CUI::Screen(&((this->super_CComponent).m_pClient)->m_UI);
      uVar2 = pCVar9->w;
      uVar3 = pCVar9->h;
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[5])
                (pCVar9->x);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])()
      ;
      pIVar6 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x13])(pIVar6,0xffffffff);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17]
      )();
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21]
      )(0);
      fVar10 = (float)uVar2 * 0.5;
      fVar13 = (float)uVar3 * 0.5;
      DrawCircle(this,fVar10,fVar13,190.0,0x40);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18]
      )();
      pIVar6 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar6->super_IInterface)._vptr_IInterface[0x13])
                (pIVar6,(ulong)(uint)g_pData->m_aImages[6].m_Id.m_Id);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17]
      )();
      iVar8 = 0;
      do {
        fVar11 = (float)iVar8 * 6.2831855 * 0.0625;
        fVar11 = (float)(~-(uint)(3.1415927 < fVar11) & (uint)fVar11 |
                        (uint)(fVar11 + -6.2831855) & -(uint)(3.1415927 < fVar11));
        uVar1 = *(undefined4 *)(&DAT_001d9a40 + (ulong)(this->m_SelectedEmote == iVar8) * 4);
        fVar12 = cosf(fVar11);
        fVar11 = sinf(fVar11);
        CRenderTools::SelectSprite
                  (&((this->super_CComponent).m_pClient)->m_RenderTools,iVar8 + 0x5c,0,0,0);
        local_40 = CONCAT44(fVar11 * 150.0 + fVar13,fVar12 * 150.0 + fVar10);
        pIVar6 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        local_38 = uVar1;
        local_34 = uVar1;
        (*(pIVar6->super_IInterface)._vptr_IInterface[0x1c])(pIVar6,&local_40,1);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0x10);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18]
      )();
      CRenderTools::RenderCursor
                (&((this->super_CComponent).m_pClient)->m_RenderTools,
                 (this->m_SelectorMouse).field_0.x + fVar10,
                 (this->m_SelectorMouse).field_1.y + fVar13,24.0);
      goto LAB_001428b5;
    }
  }
  this->m_WasActive = false;
  this->m_Active = false;
LAB_001428b5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEmoticon::OnRender()
{
	if(Client()->State() < IClient::STATE_ONLINE)
	{
		m_Active = false;
		m_WasActive = false;
		return;
	}

	if(!m_Active)
	{
		if(m_WasActive && m_SelectedEmote != -1)
			Emote(m_SelectedEmote);
		m_WasActive = false;
		return;
	}

	if(m_pClient->m_Snap.m_SpecInfo.m_Active || (m_pClient->m_Snap.m_pGameData && m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_GAMEOVER))
	{
		m_Active = false;
		m_WasActive = false;
		return;
	}

	m_WasActive = true;

	if (length(m_SelectorMouse) > 170.0f)
		m_SelectorMouse = normalize(m_SelectorMouse) * 170.0f;

	float SelectedAngle = angle(m_SelectorMouse) + 2*pi/24;
	if (SelectedAngle < 0)
		SelectedAngle += 2*pi;

	if (length(m_SelectorMouse) > 110.0f)
		m_SelectedEmote = (int)(SelectedAngle / (2*pi) * NUM_EMOTICONS);
	else
		m_SelectedEmote = -1;

	CUIRect Screen = *UI()->Screen();

	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);

	Graphics()->BlendNormal();

	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	Graphics()->SetColor(0,0,0,0.3f);
	DrawCircle(Screen.w/2, Screen.h/2, 190.0f, 64);
	Graphics()->QuadsEnd();

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_EMOTICONS].m_Id);
	Graphics()->QuadsBegin();

	for (int i = 0; i < NUM_EMOTICONS; i++)
	{
		float Angle = 2*pi*i/NUM_EMOTICONS;
		if (Angle > pi)
			Angle -= 2*pi;

		bool Selected = m_SelectedEmote == i;

		float Size = Selected ? 80.0f : 50.0f;

		float NudgeX = 150.0f * cosf(Angle);
		float NudgeY = 150.0f * sinf(Angle);
		RenderTools()->SelectSprite(SPRITE_OOP + i);
		IGraphics::CQuadItem QuadItem(Screen.w/2 + NudgeX, Screen.h/2 + NudgeY, Size, Size);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	Graphics()->QuadsEnd();

	RenderTools()->RenderCursor(m_SelectorMouse.x + Screen.w/2, m_SelectorMouse.y + Screen.h/2, 24.0f);
}